

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

void glcts::anon_unknown_0::Output(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  char *local_38;
  char *logLine;
  undefined4 local_28;
  int MAX_OUTPUT_STRING_SIZE;
  va_list args;
  char *format_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  MAX_OUTPUT_STRING_SIZE = 0x30;
  local_28 = 8;
  logLine._4_4_ = 40000;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  args[0].reg_save_area = format;
  vsnprintf(Output::temp,39999,format,&local_28);
  Output::temp[39999] = '\0';
  local_38 = strtok(Output::temp,"\n");
  while (local_38 != (char *)0x0) {
    tcu::TestLog::writeMessage(glcts::(anonymous_namespace)::currentLog,local_38);
    local_38 = strtok((char *)0x0,"\n");
  }
  return;
}

Assistant:

void Output(const char* format, ...)
{
	va_list args;
	va_start(args, format);

	const int   MAX_OUTPUT_STRING_SIZE = 40000;
	static char temp[MAX_OUTPUT_STRING_SIZE];

	vsnprintf(temp, MAX_OUTPUT_STRING_SIZE - 1, format, args);
	temp[MAX_OUTPUT_STRING_SIZE - 1] = '\0';

	char* logLine = strtok(temp, "\n");
	while (logLine != NULL)
	{
		currentLog->writeMessage(logLine);
		logLine = strtok(NULL, "\n");
	}
	va_end(args);
}